

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskBuilder.cpp
# Opt level: O2

int __thiscall
DiskBuilder::LoadDisk
          (DiskBuilder *this,
          vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *file_list,
          IDisk **created_disk,ILoadingProgress *loading_progress)

{
  pointer ppFVar1;
  FormatType *pFVar2;
  pointer ppFVar3;
  int iVar4;
  pointer ppFVar5;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> local_48;
  
  ppFVar3 = (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    ppFVar5 = ppFVar3;
    ppFVar1 = (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar5 == ppFVar1) break;
    pFVar2 = *ppFVar5;
    std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::vector
              (&local_48,file_list);
    iVar4 = (*pFVar2->_vptr_FormatType[7])(pFVar2,&local_48,created_disk,loading_progress);
    std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::~vector(&local_48);
    ppFVar3 = ppFVar5 + 1;
  } while (iVar4 != 0);
  return -(uint)(ppFVar5 == ppFVar1);
}

Assistant:

int DiskBuilder::LoadDisk(std::vector<FormatType::TrackItem> file_list, IDisk*& created_disk,
                          ILoadingProgress* loading_progress)
{
   for (auto it = format_list_.begin(); it != format_list_.end(); it++)
   {
      if ((*it)->LoadDisk(file_list, created_disk, loading_progress) == 0)
         return 0;;
   }
   return -1;
}